

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

void __thiscall
miniros::MasterLink::paramUpdateCallback(MasterLink *this,RpcValue *params,RpcValue *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  XmlRpcValue *pXVar3;
  string local_58;
  XmlRpcValue local_38;
  
  local_58._M_dataplus._M_p._0_4_ = 1;
  pXVar3 = XmlRpc::XmlRpcValue::operator[](result,0);
  XmlRpc::XmlRpcValue::operator=(pXVar3,(int *)&local_58);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38,&local_58);
  pXVar3 = XmlRpc::XmlRpcValue::operator[](result,1);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&local_38);
  XmlRpc::XmlRpcValue::invalidate(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
  pXVar3 = XmlRpc::XmlRpcValue::operator[](result,2);
  XmlRpc::XmlRpcValue::operator=(pXVar3,(int *)&local_58);
  pXVar3 = XmlRpc::XmlRpcValue::operator[](params,1);
  XmlRpc::XmlRpcValue::assertType(pXVar3,TypeString);
  pcVar2 = (((pXVar3->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,
             (((pXVar3->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish + (long)pcVar2);
  pXVar3 = XmlRpc::XmlRpcValue::operator[](params,2);
  update(this,&local_58,pXVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MasterLink::paramUpdateCallback(const RpcValue& params, RpcValue& result)
{
  result[0] = 1;
  result[1] = std::string("");
  result[2] = 0;

  this->update((std::string)params[1], params[2]);
}